

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_prn.cc
# Opt level: O3

int X509V3_extensions_print
              (BIO *out,char *title,stack_st_X509_EXTENSION *exts,ulong flag,int indent)

{
  int iVar1;
  size_t sVar2;
  X509_EXTENSION *ex;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  size_t sVar3;
  char *pcVar4;
  
  sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)exts);
  if (sVar2 != 0) {
    if (title != (char *)0x0) {
      BIO_printf(out,"%*s%s:\n",indent,"",title);
      indent = indent + 4;
    }
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)exts);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        ex = (X509_EXTENSION *)OPENSSL_sk_value((OPENSSL_STACK *)exts,sVar2);
        if ((indent != 0) && (iVar1 = BIO_printf(out,"%*s",(ulong)(uint)indent,""), iVar1 < 1)) {
          return 0;
        }
        a = X509_EXTENSION_get_object(ex);
        i2a_ASN1_OBJECT(out,a);
        iVar1 = X509_EXTENSION_get_critical(ex);
        pcVar4 = "critical";
        if (iVar1 == 0) {
          pcVar4 = "";
        }
        iVar1 = BIO_printf(out,": %s\n",pcVar4);
        if (iVar1 < 1) {
          return 0;
        }
        iVar1 = X509V3_EXT_print(out,ex,flag,indent + 4U);
        if (iVar1 == 0) {
          BIO_printf(out,"%*s",(ulong)(indent + 4U),"");
          v = X509_EXTENSION_get_data(ex);
          ASN1_STRING_print(out,v);
        }
        iVar1 = BIO_write(out,"\n",1);
        if (iVar1 < 1) {
          return 0;
        }
        sVar2 = sVar2 + 1;
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)exts);
      } while (sVar2 < sVar3);
    }
  }
  return 1;
}

Assistant:

int X509V3_extensions_print(BIO *bp, const char *title,
                            const STACK_OF(X509_EXTENSION) *exts,
                            unsigned long flag, int indent) {
  size_t i;
  int j;

  if (sk_X509_EXTENSION_num(exts) <= 0) {
    return 1;
  }

  if (title) {
    BIO_printf(bp, "%*s%s:\n", indent, "", title);
    indent += 4;
  }

  for (i = 0; i < sk_X509_EXTENSION_num(exts); i++) {
    const X509_EXTENSION *ex = sk_X509_EXTENSION_value(exts, i);
    if (indent && BIO_printf(bp, "%*s", indent, "") <= 0) {
      return 0;
    }
    const ASN1_OBJECT *obj = X509_EXTENSION_get_object(ex);
    i2a_ASN1_OBJECT(bp, obj);
    j = X509_EXTENSION_get_critical(ex);
    if (BIO_printf(bp, ": %s\n", j ? "critical" : "") <= 0) {
      return 0;
    }
    if (!X509V3_EXT_print(bp, ex, flag, indent + 4)) {
      BIO_printf(bp, "%*s", indent + 4, "");
      ASN1_STRING_print(bp, X509_EXTENSION_get_data(ex));
    }
    if (BIO_write(bp, "\n", 1) <= 0) {
      return 0;
    }
  }
  return 1;
}